

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int quicly_open_stream(quicly_conn_t *conn,quicly_stream_t **_stream,int uni)

{
  st_quicly_stream_open_t *psVar1;
  int iVar2;
  long lVar3;
  quicly_stream_t *arg2;
  uint32_t initial_max_stream_data_local;
  anon_struct_80_2_8a8f9515_for_max_streams *paVar4;
  st_quicly_conn_streamgroup_state_t *psVar5;
  
  if (uni == 0) {
    psVar5 = &(conn->super).local.bidi;
    paVar4 = (anon_struct_80_2_8a8f9515_for_max_streams *)&(conn->egress).max_streams.bidi;
    initial_max_stream_data_local =
         (uint32_t)(((conn->super).ctx)->transport_params).max_stream_data.bidi_local;
    lVar3 = 0x298;
  }
  else {
    psVar5 = &(conn->super).local.uni;
    paVar4 = &(conn->egress).max_streams;
    initial_max_stream_data_local = 0;
    lVar3 = 0x2a0;
  }
  arg2 = open_stream(conn,psVar5->next_stream_id,initial_max_stream_data_local,
                     *(uint64_t *)((conn->super).local.cid_set.cids[0].cid.cid + lVar3 + -0x30));
  if (arg2 == (quicly_stream_t *)0x0) {
    iVar2 = 0x201;
  }
  else {
    psVar5->num_streams = psVar5->num_streams + 1;
    psVar5->next_stream_id = psVar5->next_stream_id + 4;
    if ((paVar4->uni).count <= (ulong)(arg2->stream_id / 4)) {
      arg2->field_0xb8 = arg2->field_0xb8 | 1;
      quicly_linklist_insert
                ((quicly_linklist_t *)
                 (conn->egress).retire_cid.sequences[(ulong)(uni == 0) * 2 + -7],
                 &(arg2->_send_aux).pending_link.control);
    }
    QUICLY_TRACER_STREAM_ON_OPEN(conn,(conn->stash).now,arg2);
    psVar1 = ((conn->super).ctx)->stream_open;
    iVar2 = (*psVar1->cb)(psVar1,arg2);
    if (iVar2 == 0) {
      *_stream = arg2;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int quicly_open_stream(quicly_conn_t *conn, quicly_stream_t **_stream, int uni)
{
    quicly_stream_t *stream;
    struct st_quicly_conn_streamgroup_state_t *group;
    uint64_t *max_stream_count;
    uint32_t max_stream_data_local;
    uint64_t max_stream_data_remote;
    int ret;

    /* determine the states */
    if (uni) {
        group = &conn->super.local.uni;
        max_stream_count = &conn->egress.max_streams.uni.count;
        max_stream_data_local = 0;
        max_stream_data_remote = conn->super.remote.transport_params.max_stream_data.uni;
    } else {
        group = &conn->super.local.bidi;
        max_stream_count = &conn->egress.max_streams.bidi.count;
        max_stream_data_local = (uint32_t)conn->super.ctx->transport_params.max_stream_data.bidi_local;
        max_stream_data_remote = conn->super.remote.transport_params.max_stream_data.bidi_remote;
    }

    /* open */
    if ((stream = open_stream(conn, group->next_stream_id, max_stream_data_local, max_stream_data_remote)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ++group->num_streams;
    group->next_stream_id += 4;

    /* adjust blocked */
    if (stream->stream_id / 4 >= *max_stream_count) {
        stream->streams_blocked = 1;
        quicly_linklist_insert((uni ? &conn->egress.pending_streams.blocked.uni : &conn->egress.pending_streams.blocked.bidi)->prev,
                               &stream->_send_aux.pending_link.control);
    }

    /* application-layer initialization */
    QUICLY_PROBE(STREAM_ON_OPEN, conn, conn->stash.now, stream);
    if ((ret = conn->super.ctx->stream_open->cb(conn->super.ctx->stream_open, stream)) != 0)
        return ret;

    *_stream = stream;
    return 0;
}